

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

int __thiscall
JsUtil::List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Add(List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this,
   DebuggerScope **item)

{
  int iVar1;
  
  EnsureArray(this);
  Memory::WriteBarrierPtr<Js::DebuggerScope>::WriteBarrierSet
            ((this->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr +
             (this->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).
             count,*item);
  iVar1 = (this->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count;
  (this->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count =
       iVar1 + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }